

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels(uchar *pixels,int type,int w,int h,int stride,Allocator *allocator)

{
  uint in_EDX;
  Mat *in_RDI;
  Allocator *in_stack_00000038;
  Mat *in_stack_00000040;
  int in_stack_0000004c;
  Mat *m;
  Allocator *in_stack_000000d0;
  Mat *in_stack_000000d8;
  undefined4 in_stack_000000e0;
  int in_stack_000000e4;
  int in_stack_000000e8;
  int in_stack_000000ec;
  undefined4 in_stack_000000f0;
  int in_stack_000000f4;
  int in_stack_000000f8;
  int in_stack_000000fc;
  uchar *in_stack_00000100;
  Allocator *in_stack_00000148;
  Mat *in_stack_00000150;
  int in_stack_0000015c;
  int in_stack_00000160;
  int in_stack_00000164;
  uchar *in_stack_00000168;
  Mat *pMVar1;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  uint7 in_stack_ffffffffffffff90;
  undefined1 uVar2;
  
  uVar2 = 0;
  in_RDI->data = (void *)0x0;
  in_RDI->refcount = (int *)0x0;
  in_RDI->elemsize = 0;
  in_RDI->elempack = 0;
  in_RDI->allocator = (Allocator *)0x0;
  in_RDI->dims = 0;
  in_RDI->w = 0;
  in_RDI->h = 0;
  in_RDI->d = 0;
  in_RDI->c = 0;
  in_RDI->cstep = 0;
  if ((in_EDX & 0xffff0000) == 0) {
    pMVar1 = in_RDI;
    if ((in_EDX == 1) || (in_EDX == 2)) {
      from_rgb((uchar *)CONCAT44(in_stack_000000f4,in_stack_000000f0),in_stack_000000ec,
               in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d0);
    }
    if (in_EDX == 3) {
      from_gray((uchar *)CONCAT17(uVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
                in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,pMVar1,(Allocator *)in_RDI);
    }
    if ((in_EDX != 4) && (in_EDX != 5)) {
      return in_RDI;
    }
    from_rgba(in_stack_00000168,in_stack_00000164,in_stack_00000160,in_stack_0000015c,
              in_stack_00000150,in_stack_00000148);
    return in_RDI;
  }
  if (in_EDX == 0x10002) {
LAB_0013c51a:
    from_rgb2bgr(in_stack_00000100,in_stack_000000fc,in_stack_000000f8,in_stack_000000f4,
                 (Mat *)CONCAT44(in_stack_000000ec,in_stack_000000e8),
                 (Allocator *)CONCAT44(in_stack_000000e4,in_stack_000000e0));
    return in_RDI;
  }
  if (in_EDX == 0x10003) {
LAB_0013c70e:
    from_gray2rgb((uchar *)CONCAT44(in_stack_000000f4,in_stack_000000f0),in_stack_000000ec,
                  in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d0);
    return in_RDI;
  }
  if (in_EDX == 0x10004) {
LAB_0013c762:
    from_rgba2rgb((uchar *)CONCAT44(in_stack_000000f4,in_stack_000000f0),in_stack_000000ec,
                  in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d0);
    return in_RDI;
  }
  if (in_EDX != 0x10005) {
    if (in_EDX == 0x20001) goto LAB_0013c51a;
    if (in_EDX == 0x20003) goto LAB_0013c70e;
    if (in_EDX != 0x20004) {
      if (in_EDX == 0x20005) goto LAB_0013c762;
      if (in_EDX == 0x30001) {
        from_rgb2gray((uchar *)(ulong)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                      in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_RDI,(Allocator *)in_RDI
                     );
        return in_RDI;
      }
      if (in_EDX == 0x30002) {
        from_bgr2gray((uchar *)(ulong)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                      in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_RDI,(Allocator *)in_RDI
                     );
        return in_RDI;
      }
      if (in_EDX == 0x30004) {
        from_rgba2gray((uchar *)(ulong)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                       in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_RDI,
                       (Allocator *)in_RDI);
        return in_RDI;
      }
      if (in_EDX == 0x30005) {
        from_bgra2gray((uchar *)(ulong)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                       in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_RDI,
                       (Allocator *)in_RDI);
        return in_RDI;
      }
      if (in_EDX == 0x40001) {
LAB_0013c690:
        from_rgb2rgba((uchar *)CONCAT44(type,w),h,stride,in_stack_0000004c,in_stack_00000040,
                      in_stack_00000038);
        return in_RDI;
      }
      if (in_EDX != 0x40002) {
        if (in_EDX == 0x40003) {
LAB_0013c738:
          from_gray2rgba((uchar *)CONCAT44(type,w),h,stride,in_stack_0000004c,in_stack_00000040,
                         in_stack_00000038);
          return in_RDI;
        }
        if (in_EDX != 0x40005) {
          if (in_EDX == 0x50001) goto LAB_0013c6e4;
          if (in_EDX == 0x50002) goto LAB_0013c690;
          if (in_EDX == 0x50003) goto LAB_0013c738;
          if (in_EDX != 0x50004) {
            fprintf(_stderr,"unimplemented convert type %d",(ulong)in_EDX);
            fprintf(_stderr,"\n");
            return in_RDI;
          }
        }
        from_rgba2bgra(in_stack_00000168,in_stack_00000164,in_stack_00000160,in_stack_0000015c,
                       in_stack_00000150,in_stack_00000148);
        return in_RDI;
      }
LAB_0013c6e4:
      from_bgr2rgba((uchar *)CONCAT44(type,w),h,stride,in_stack_0000004c,in_stack_00000040,
                    in_stack_00000038);
      return in_RDI;
    }
  }
  from_rgba2bgr((uchar *)CONCAT44(in_stack_000000f4,in_stack_000000f0),in_stack_000000ec,
                in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d0);
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}